

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clara.hpp
# Opt level: O0

Result * __thiscall clara::detail::Parser::validate(Result *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  reference pOVar2;
  reference pAVar3;
  Arg *arg;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<clara::detail::Arg,_std::allocator<clara::detail::Arg>_> *__range2_1;
  Opt *opt;
  const_iterator __end2;
  const_iterator __begin2;
  vector<clara::detail::Opt,_std::allocator<clara::detail::Opt>_> *__range2;
  Parser *this_local;
  Result *result;
  
  __end2 = std::vector<clara::detail::Opt,_std::allocator<clara::detail::Opt>_>::begin
                     (&this->m_options);
  opt = (Opt *)std::vector<clara::detail::Opt,_std::allocator<clara::detail::Opt>_>::end
                         (&this->m_options);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_clara::detail::Opt_*,_std::vector<clara::detail::Opt,_std::allocator<clara::detail::Opt>_>_>
                                     *)&opt), bVar1) {
    pOVar2 = __gnu_cxx::
             __normal_iterator<const_clara::detail::Opt_*,_std::vector<clara::detail::Opt,_std::allocator<clara::detail::Opt>_>_>
             ::operator*(&__end2);
    (*(pOVar2->super_ParserRefImpl<clara::detail::Opt>).
      super_ComposableParserImpl<clara::detail::Opt>.super_ParserBase._vptr_ParserBase[2])
              (__return_storage_ptr__);
    bVar1 = BasicResult::operator_cast_to_bool((BasicResult *)__return_storage_ptr__);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    BasicResult<void>::~BasicResult(__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<const_clara::detail::Opt_*,_std::vector<clara::detail::Opt,_std::allocator<clara::detail::Opt>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::vector<clara::detail::Arg,_std::allocator<clara::detail::Arg>_>::begin
                       (&this->m_args);
  arg = (Arg *)std::vector<clara::detail::Arg,_std::allocator<clara::detail::Arg>_>::end
                         (&this->m_args);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<const_clara::detail::Arg_*,_std::vector<clara::detail::Arg,_std::allocator<clara::detail::Arg>_>_>
                        *)&arg);
    if (!bVar1) {
      BasicResult<void>::ok();
      return __return_storage_ptr__;
    }
    pAVar3 = __gnu_cxx::
             __normal_iterator<const_clara::detail::Arg_*,_std::vector<clara::detail::Arg,_std::allocator<clara::detail::Arg>_>_>
             ::operator*(&__end2_1);
    (*(pAVar3->super_ParserRefImpl<clara::detail::Arg>).
      super_ComposableParserImpl<clara::detail::Arg>.super_ParserBase._vptr_ParserBase[2])
              (__return_storage_ptr__);
    bVar1 = BasicResult::operator_cast_to_bool((BasicResult *)__return_storage_ptr__);
    if (!bVar1) break;
    BasicResult<void>::~BasicResult(__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<const_clara::detail::Arg_*,_std::vector<clara::detail::Arg,_std::allocator<clara::detail::Arg>_>_>
    ::operator++(&__end2_1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto validate() const -> Result override {
            for( auto const &opt : m_options ) {
                auto result = opt.validate();
                if( !result )
                    return result;
            }
            for( auto const &arg : m_args ) {
                auto result = arg.validate();
                if( !result )
                    return result;
            }
            return Result::ok();
        }